

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathFreeNodeSet(xmlNodeSetPtr obj)

{
  xmlNodePtr ns;
  long lVar1;
  
  if (obj != (xmlNodeSetPtr)0x0) {
    if (obj->nodeTab != (xmlNodePtr *)0x0) {
      if (0 < obj->nodeNr) {
        lVar1 = 0;
        do {
          ns = obj->nodeTab[lVar1];
          if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 < obj->nodeNr);
      }
      (*xmlFree)(obj->nodeTab);
    }
    (*xmlFree)(obj);
    return;
  }
  return;
}

Assistant:

void
xmlXPathFreeNodeSet(xmlNodeSetPtr obj) {
    if (obj == NULL) return;
    if (obj->nodeTab != NULL) {
	int i;

	/* @@ with_ns to check whether namespace nodes should be looked at @@ */
	for (i = 0;i < obj->nodeNr;i++)
	    if ((obj->nodeTab[i] != NULL) &&
		(obj->nodeTab[i]->type == XML_NAMESPACE_DECL))
		xmlXPathNodeSetFreeNs((xmlNsPtr) obj->nodeTab[i]);
	xmlFree(obj->nodeTab);
    }
    xmlFree(obj);
}